

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::anon_unknown_0::ExtensionSetTest_DynamicExtensions_Test::TestBody
          (ExtensionSetTest_DynamicExtensions_Test *this)

{
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  bool bVar1;
  Descriptor *pDVar2;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>_>
  *this_01;
  Descriptor *pDVar3;
  string *psVar4;
  DescriptorPool *underlay;
  FileDescriptor *this_02;
  ForeignMessage *pFVar5;
  TestDynamicExtensions_DynamicMessageType *pTVar6;
  UnknownFieldSet *pUVar7;
  FieldDescriptor *pFVar8;
  Reflection *this_03;
  MessageLite *from;
  Message *pMVar9;
  Arena *arena;
  InternalMetadata arena_00;
  pointer *__ptr;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_04;
  AlphaNum *in_R8;
  char *pcVar10;
  char *in_R9;
  int index;
  string_view prefix;
  string_view value;
  Metadata MVar11;
  string_view value_00;
  string_view name;
  string_view name_00;
  string_view text;
  string local_4b8;
  AssertionResult gtest_ar__1;
  AssertHelper local_478;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar__4;
  AssertionResult gtest_ar_;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_428;
  RepeatedField<int> local_410 [3];
  ArrayInputStream raw_input;
  string message_text;
  TestAllExtensions message;
  string data;
  DynamicMessageFactory dynamic_factory;
  TestDynamicExtensions dynamic_extension;
  DescriptorPool dynamic_pool;
  FileDescriptorProto dynamic_proto;
  DescriptorProto template_descriptor_proto;
  
  FileDescriptorProto::FileDescriptorProto(&dynamic_proto);
  pDVar2 = proto2_unittest::TestDynamicExtensions::GetDescriptor();
  FileDescriptor::CopyHeadingTo(pDVar2->file_,&dynamic_proto);
  this_00 = &dynamic_proto.field_0._impl_.dependency_;
  RepeatedPtrFieldBase::Clear<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
            (&this_00->super_RepeatedPtrFieldBase);
  dynamic_proto.field_0._impl_._has_bits_.has_bits_[0]._0_1_ =
       dynamic_proto.field_0._impl_._has_bits_.has_bits_[0]._0_1_ | 1;
  arena_00 = dynamic_proto.super_Message.super_MessageLite._internal_metadata_;
  if ((dynamic_proto.super_Message.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
    arena_00.ptr_ =
         *(undefined8 *)
          (dynamic_proto.super_Message.super_MessageLite._internal_metadata_.ptr_ &
          0xfffffffffffffffe);
  }
  ArenaStringPtr::Set(&dynamic_proto.field_0._impl_.name_,"dynamic_extensions_test.proto",
                      (Arena *)arena_00.ptr_);
  pDVar2 = proto2_unittest::TestAllExtensions::GetDescriptor();
  psVar4 = pDVar2->file_->name_;
  template_descriptor_proto.super_Message.super_MessageLite._internal_metadata_.ptr_ =
       (intptr_t)(psVar4->_M_dataplus)._M_p;
  template_descriptor_proto.super_Message.super_MessageLite._vptr_MessageLite =
       (_func_int **)psVar4->_M_string_length;
  AddToRepeatedPtrField<std::basic_string_view<char,std::char_traits<char>>>
            (this_00,(basic_string_view<char,_std::char_traits<char>_> *)&template_descriptor_proto)
  ;
  dynamic_proto.field_0._impl_._has_bits_.has_bits_[0]._0_1_ =
       dynamic_proto.field_0._impl_._has_bits_.has_bits_[0]._0_1_ | 2;
  if ((dynamic_proto.super_Message.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
    dynamic_proto.super_Message.super_MessageLite._internal_metadata_.ptr_ =
         *(undefined8 *)
          (dynamic_proto.super_Message.super_MessageLite._internal_metadata_.ptr_ &
          0xfffffffffffffffe);
  }
  ArenaStringPtr::Set(&dynamic_proto.field_0._impl_.package_,"dynamic_extensions",
                      (Arena *)dynamic_proto.super_Message.super_MessageLite._internal_metadata_.
                               ptr_);
  pDVar2 = proto2_unittest::TestDynamicExtensions::GetDescriptor();
  DescriptorProto::DescriptorProto(&template_descriptor_proto);
  Descriptor::CopyTo(pDVar2,&template_descriptor_proto);
  RepeatedPtrField<google::protobuf::DescriptorProto>::MergeFrom
            (&dynamic_proto.field_0._impl_.message_type_,
             &template_descriptor_proto.field_0._impl_.nested_type_);
  RepeatedPtrField<google::protobuf::EnumDescriptorProto>::MergeFrom
            (&dynamic_proto.field_0._impl_.enum_type_,
             &template_descriptor_proto.field_0._impl_.enum_type_);
  RepeatedPtrField<google::protobuf::FieldDescriptorProto>::MergeFrom
            (&dynamic_proto.field_0._impl_.extension_,
             &template_descriptor_proto.field_0._impl_.field_);
  for (index = 0;
      index < dynamic_proto.field_0._impl_.extension_.super_RepeatedPtrFieldBase.current_size_;
      index = index + 1) {
    this_01 = RepeatedPtrFieldBase::
              Mutable<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                        (&dynamic_proto.field_0._impl_.extension_.super_RepeatedPtrFieldBase,index);
    pDVar3 = proto2_unittest::TestAllExtensions::GetDescriptor();
    pcVar10 = (pDVar3->all_names_).payload_;
    value_00._M_len = (ulong)*(ushort *)(pcVar10 + 2);
    (this_01->field_0)._impl_._has_bits_.has_bits_[0] =
         (this_01->field_0)._impl_._has_bits_.has_bits_[0] | 2;
    arena = (Arena *)(this_01->super_Message).super_MessageLite._internal_metadata_.ptr_;
    if (((ulong)arena & 1) != 0) {
      arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
    }
    value_00._M_str = pcVar10 + ~value_00._M_len;
    ArenaStringPtr::Set(&(this_01->field_0)._impl_.extendee_,value_00,arena);
    dynamic_pool._0_16_ = absl::lts_20250127::NullSafeStringView(".");
    pcVar10 = (pDVar2->all_names_).payload_;
    dynamic_extension.super_Message.super_MessageLite._vptr_MessageLite =
         (_func_int **)(ulong)*(ushort *)(pcVar10 + 2);
    dynamic_extension.super_Message.super_MessageLite._internal_metadata_.ptr_ =
         (intptr_t)
         (pcVar10 + ~(ulong)dynamic_extension.super_Message.super_MessageLite._vptr_MessageLite);
    gtest_ar_ = (AssertionResult)absl::lts_20250127::NullSafeStringView(".");
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)&dynamic_factory,(lts_20250127 *)&dynamic_pool,
               (AlphaNum *)&dynamic_extension,(AlphaNum *)&gtest_ar_,in_R8);
    if ((undefined1  [80])((undefined1  [80])this_01->field_0 & (undefined1  [80])0x4) !=
        (undefined1  [80])0x0) {
      psVar4 = FieldDescriptorProto::_internal_mutable_type_name_abi_cxx11_(this_01);
      prefix._M_str = (char *)dynamic_factory.super_MessageFactory._vptr_MessageFactory;
      prefix._M_len = (size_t)dynamic_factory.pool_;
      text._M_str = (psVar4->_M_dataplus)._M_p;
      text._M_len = psVar4->_M_string_length;
      bVar1 = absl::lts_20250127::StartsWith(text,prefix);
      if (bVar1) {
        std::__cxx11::string::replace((ulong)psVar4,0,(char *)dynamic_factory.pool_);
      }
    }
    std::__cxx11::string::~string((string *)&dynamic_factory);
  }
  underlay = DescriptorPool::generated_pool();
  DescriptorPool::DescriptorPool(&dynamic_pool,underlay);
  this_02 = DescriptorPool::BuildFile(&dynamic_pool,&dynamic_proto);
  gtest_ar_._1_7_ = gtest_ar_._1_7_;
  gtest_ar_.success_ = this_02 != (FileDescriptor *)0x0;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )0x0;
  if (this_02 == (FileDescriptor *)0x0) {
    testing::Message::Message((Message *)&dynamic_factory);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&dynamic_extension,(internal *)&gtest_ar_,(AssertionResult *)0xd94515,
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&message,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_unittest.cc"
               ,0x4d7,(char *)dynamic_extension.super_Message.super_MessageLite._vptr_MessageLite);
    testing::internal::AssertHelper::operator=((AssertHelper *)&message,(Message *)&dynamic_factory)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&message);
    std::__cxx11::string::~string((string *)&dynamic_extension);
    if (dynamic_factory.super_MessageFactory._vptr_MessageFactory != (_func_int **)0x0) {
      (**(code **)(*dynamic_factory.super_MessageFactory._vptr_MessageFactory + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    goto LAB_005530ca;
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  DynamicMessageFactory::DynamicMessageFactory(&dynamic_factory,&dynamic_pool);
  dynamic_factory.delegate_to_generated_factory_ = true;
  data._M_dataplus._M_p = (pointer)&data.field_2;
  data._M_string_length = 0;
  data.field_2._M_local_buf[0] = '\0';
  proto2_unittest::TestDynamicExtensions::TestDynamicExtensions(&dynamic_extension);
  proto2_unittest::TestDynamicExtensions::TestDynamicExtensions((TestDynamicExtensions *)&gtest_ar_)
  ;
  local_410[2].soo_rep_.field_0._8_4_ = 0x7b;
  proto2_unittest::TestDynamicExtensions::set_enum_extension
            ((TestDynamicExtensions *)&gtest_ar_,FOREIGN_BAR);
  proto2_unittest::TestDynamicExtensions::set_dynamic_enum_extension
            ((TestDynamicExtensions *)&gtest_ar_,TestDynamicExtensions_DynamicEnumType_DYNAMIC_BAZ);
  pFVar5 = proto2_unittest::TestDynamicExtensions::mutable_message_extension
                     ((TestDynamicExtensions *)&gtest_ar_);
  (pFVar5->field_0)._impl_.c_ = 0x1c8;
  *(byte *)&pFVar5->field_0 = *(byte *)&pFVar5->field_0 | 1;
  pTVar6 = proto2_unittest::TestDynamicExtensions::mutable_dynamic_message_extension
                     ((TestDynamicExtensions *)&gtest_ar_);
  (pTVar6->field_0)._impl_.dynamic_field_ = 0x315;
  *(byte *)&pTVar6->field_0 = *(byte *)&pTVar6->field_0 | 1;
  AddToRepeatedPtrField<char_const(&)[4]>(&local_428,(char (*) [4])0xdd11ec);
  AddToRepeatedPtrField<char_const(&)[4]>(&local_428,(char (*) [4])0xf00b40);
  RepeatedField<int>::Add(local_410,0xc);
  RepeatedField<int>::Add(local_410,-0x22);
  RepeatedField<int>::Add(local_410,0x38);
  RepeatedField<int>::Add(local_410,-0x4e);
  pUVar7 = InternalMetadata::mutable_unknown_fields<google::protobuf::UnknownFieldSet>
                     ((InternalMetadata *)&gtest_ar_.message_);
  UnknownFieldSet::AddVarint(pUVar7,0x7d2,0x3039);
  pUVar7 = InternalMetadata::mutable_unknown_fields<google::protobuf::UnknownFieldSet>
                     ((InternalMetadata *)&gtest_ar_.message_);
  value._M_str = "unknown";
  value._M_len = 7;
  UnknownFieldSet::AddLengthDelimited(pUVar7,0xd431,value);
  MessageLite::SerializeToString((MessageLite *)&gtest_ar_,&data);
  proto2_unittest::TestDynamicExtensions::CopyFrom
            (&dynamic_extension,(TestDynamicExtensions *)&gtest_ar_);
  proto2_unittest::TestDynamicExtensions::~TestDynamicExtensions
            ((TestDynamicExtensions *)&gtest_ar_);
  proto2_unittest::TestAllExtensions::TestAllExtensions(&message);
  io::ArrayInputStream::ArrayInputStream
            (&raw_input,data._M_dataplus._M_p,(int)data._M_string_length,-1);
  io::CodedInputStream::CodedInputStream
            ((CodedInputStream *)&gtest_ar_,&raw_input.super_ZeroCopyInputStream);
  local_410[1].soo_rep_.field_0._0_8_ = &dynamic_pool;
  local_410[1].soo_rep_.field_0._8_8_ = &dynamic_factory;
  bVar1 = MessageLite::ParseFromCodedStream((MessageLite *)&message,(CodedInputStream *)&gtest_ar_);
  gtest_ar__1.success_ = bVar1;
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (bVar1) {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar__1.message_);
    gtest_ar__1.success_ = (bool)(undefined1)local_428.super_RepeatedPtrFieldBase.capacity_proxy_;
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    if ((bool)(undefined1)local_428.super_RepeatedPtrFieldBase.capacity_proxy_ == false) {
      testing::Message::Message((Message *)&local_4b8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&message_text,(internal *)&gtest_ar__1,(AssertionResult *)0xeebf54,"false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__4,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_unittest.cc"
                 ,0x503,message_text._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__4,(Message *)&local_4b8)
      ;
      goto LAB_00552918;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar__1.message_);
    io::CodedInputStream::~CodedInputStream((CodedInputStream *)&gtest_ar_);
    message_text._M_dataplus._M_p = (pointer)&message_text.field_2;
    message_text._M_string_length = 0;
    message_text.field_2._M_local_buf[0] = '\0';
    TextFormat::PrintToString(&message.super_Message,&message_text);
    testing::internal::CmpHelperEQ<char[567],std::__cxx11::string>
              ((internal *)&gtest_ar_,
               "\"[dynamic_extensions.scalar_extension]: 123\\n\" \"[dynamic_extensions.enum_extension]: FOREIGN_BAR\\n\" \"[dynamic_extensions.dynamic_enum_extension]: DYNAMIC_BAZ\\n\" \"[dynamic_extensions.message_extension] {\\n\" \"  c: 456\\n\" \"}\\n\" \"[dynamic_extensions.dynamic_message_extension] {\\n\" \"  dynamic_field: 789\\n\" \"}\\n\" \"[dynamic_extensions.repeated_extension]: \\\"foo\\\"\\n\" \"[dynamic_extensions.repeated_extension]: \\\"bar\\\"\\n\" \"[dynamic_extensions.packed_extension]: 12\\n\" \"[dynamic_extensions.packed_extension]: -34\\n\" \"[dynamic_extensions.packed_extension]: 56\\n\" \"[dynamic_extensions.packed_extension]: -78\\n\" \"2002: 12345\\n\" \"54321: \\\"unknown\\\"\\n\""
               ,"message_text",
               (char (*) [567])
               "[dynamic_extensions.scalar_extension]: 123\n[dynamic_extensions.enum_extension]: FOREIGN_BAR\n[dynamic_extensions.dynamic_enum_extension]: DYNAMIC_BAZ\n[dynamic_extensions.message_extension] {\n  c: 456\n}\n[dynamic_extensions.dynamic_message_extension] {\n  dynamic_field: 789\n}\n[dynamic_extensions.repeated_extension]: \"foo\"\n[dynamic_extensions.repeated_extension]: \"bar\"\n[dynamic_extensions.packed_extension]: 12\n[dynamic_extensions.packed_extension]: -34\n[dynamic_extensions.packed_extension]: 56\n[dynamic_extensions.packed_extension]: -78\n2002: 12345\n54321: \"unknown\"\n"
               ,&message_text);
    if (gtest_ar_.success_ == false) {
      testing::Message::Message((Message *)&raw_input);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar_.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar10 = anon_var_dwarf_651463 + 5;
      }
      else {
        pcVar10 = *(char **)gtest_ar_.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__1,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_unittest.cc"
                 ,0x51b,pcVar10);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1,(Message *)&raw_input)
      ;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1);
      if (raw_input.super_ZeroCopyInputStream._vptr_ZeroCopyInputStream != (_func_int **)0x0) {
        (**(code **)(*raw_input.super_ZeroCopyInputStream._vptr_ZeroCopyInputStream + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    MessageLite::SerializeAsString_abi_cxx11_((string *)&gtest_ar_,(MessageLite *)&message);
    bVar1 = TestUtil::EqualsToSerialized<proto2_unittest::TestDynamicExtensions>
                      (&dynamic_extension,(string *)&gtest_ar_);
    raw_input.super_ZeroCopyInputStream._vptr_ZeroCopyInputStream._0_1_ = bVar1;
    raw_input.data_ = (uint8_t *)0x0;
    std::__cxx11::string::~string((string *)&gtest_ar_);
    if ((char)raw_input.super_ZeroCopyInputStream._vptr_ZeroCopyInputStream == '\0') {
      testing::Message::Message((Message *)&gtest_ar__1);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar_,(internal *)&raw_input,
                 (AssertionResult *)
                 "EqualsToSerialized(dynamic_extension, message.SerializeAsString())","false","true"
                 ,in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_4b8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_unittest.cc"
                 ,0x51f,(char *)gtest_ar_._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_4b8,(Message *)&gtest_ar__1)
      ;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_4b8);
      std::__cxx11::string::~string((string *)&gtest_ar_);
      if (gtest_ar__1._0_8_ != 0) {
        (**(code **)(*(long *)gtest_ar__1._0_8_ + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&raw_input.data_);
    proto2_unittest::TestAllExtensions::TestAllExtensions((TestAllExtensions *)&raw_input);
    io::ArrayInputStream::ArrayInputStream
              ((ArrayInputStream *)&gtest_ar__1,data._M_dataplus._M_p,(int)data._M_string_length,-1)
    ;
    io::CodedInputStream::CodedInputStream
              ((CodedInputStream *)&gtest_ar_,(ZeroCopyInputStream *)&gtest_ar__1);
    local_410[1].soo_rep_.field_0._0_8_ = &dynamic_pool;
    local_410[1].soo_rep_.field_0._8_8_ = &dynamic_factory;
    gtest_ar__4.success_ =
         WireFormat::ParseAndMergePartial((CodedInputStream *)&gtest_ar_,(Message *)&raw_input);
    gtest_ar__4.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    if (gtest_ar__4.success_) {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar__4.message_);
      gtest_ar__4.success_ = (bool)(undefined1)local_428.super_RepeatedPtrFieldBase.capacity_proxy_;
      gtest_ar__4.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      if ((undefined1)local_428.super_RepeatedPtrFieldBase.capacity_proxy_ == '\0') {
        testing::Message::Message((Message *)&gtest_ar_1);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_4b8,(internal *)&gtest_ar__4,(AssertionResult *)0xeebf54,"false","true",
                   in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_478,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_unittest.cc"
                   ,0x528,local_4b8._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&local_478,(Message *)&gtest_ar_1);
        goto LAB_00552c3f;
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar__4.message_);
      Message::DebugString_abi_cxx11_(&local_4b8,&message.super_Message);
      Message::DebugString_abi_cxx11_((string *)&gtest_ar__4,(Message *)&raw_input);
      testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
                ((internal *)&gtest_ar_1,"message.DebugString()","message2.DebugString()",&local_4b8
                 ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar__4)
      ;
      std::__cxx11::string::~string((string *)&gtest_ar__4);
      std::__cxx11::string::~string((string *)&local_4b8);
      if (gtest_ar_1.success_ == false) {
        testing::Message::Message((Message *)&local_4b8);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar_1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl ==
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar10 = anon_var_dwarf_651463 + 5;
        }
        else {
          pcVar10 = *(char **)gtest_ar_1.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar__4,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_unittest.cc"
                   ,0x529,pcVar10);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar__4,(Message *)&local_4b8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__4);
        if ((long *)local_4b8._M_dataplus._M_p != (long *)0x0) {
          (**(code **)(*(long *)local_4b8._M_dataplus._M_p + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_1.message_);
      io::CodedInputStream::~CodedInputStream((CodedInputStream *)&gtest_ar_);
      proto2_unittest::TestAllExtensions::~TestAllExtensions((TestAllExtensions *)&raw_input);
      name._M_str = "message_extension";
      name._M_len = 0x11;
      pFVar8 = FileDescriptor::FindExtensionByName(this_02,name);
      raw_input.data_ = (uint8_t *)0x0;
      raw_input.super_ZeroCopyInputStream._vptr_ZeroCopyInputStream._0_1_ =
           pFVar8 != (FieldDescriptor *)0x0;
      if (pFVar8 == (FieldDescriptor *)0x0) {
        testing::Message::Message((Message *)&gtest_ar__1);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar_,(internal *)&raw_input,(AssertionResult *)0xddc52a,"false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_4b8,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_unittest.cc"
                   ,0x530,(char *)gtest_ar_._0_8_);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&local_4b8,(Message *)&gtest_ar__1);
LAB_00553012:
        this_04 = (unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&raw_input.data_;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_4b8);
        std::__cxx11::string::~string((string *)&gtest_ar_);
        if (gtest_ar__1._0_8_ != 0) {
          (**(code **)(*(long *)gtest_ar__1._0_8_ + 8))();
        }
      }
      else {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&raw_input.data_);
        this_03 = proto2_unittest::TestAllExtensions::GetReflection();
        from = &Reflection::GetMessage(this_03,&message.super_Message,pFVar8,(MessageFactory *)0x0)
                ->super_MessageLite;
        pFVar5 = DynamicCastMessage<proto2_unittest::ForeignMessage>(from);
        raw_input.data_ = (uint8_t *)0x0;
        raw_input.super_ZeroCopyInputStream._vptr_ZeroCopyInputStream._0_1_ =
             pFVar5 != (ForeignMessage *)0x0;
        if (pFVar5 == (ForeignMessage *)0x0) {
          testing::Message::Message((Message *)&gtest_ar__1);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar_,(internal *)&raw_input,
                     (AssertionResult *)"typed_sub_message != nullptr","false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_4b8,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_unittest.cc"
                     ,0x535,(char *)gtest_ar_._0_8_);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_4b8,(Message *)&gtest_ar__1);
          goto LAB_00553012;
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&raw_input.data_);
        raw_input.super_ZeroCopyInputStream._vptr_ZeroCopyInputStream._0_4_ = 0x1c8;
        gtest_ar__1._0_4_ = (pFVar5->field_0)._impl_.c_;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&gtest_ar_,"456","typed_sub_message->c()",(int *)&raw_input,
                   (int *)&gtest_ar__1);
        if (gtest_ar_.success_ == false) {
          testing::Message::Message((Message *)&raw_input);
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar_.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl ==
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pcVar10 = anon_var_dwarf_651463 + 5;
          }
          else {
            pcVar10 = *(char **)gtest_ar_.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar__1,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_unittest.cc"
                     ,0x536,pcVar10);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar__1,(Message *)&raw_input);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1);
          if (raw_input.super_ZeroCopyInputStream._vptr_ZeroCopyInputStream != (_func_int **)0x0) {
            (**(code **)(*raw_input.super_ZeroCopyInputStream._vptr_ZeroCopyInputStream + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        name_00._M_str = "dynamic_message_extension";
        name_00._M_len = 0x19;
        pFVar8 = FileDescriptor::FindExtensionByName(this_02,name_00);
        raw_input.data_ = (uint8_t *)0x0;
        raw_input.super_ZeroCopyInputStream._vptr_ZeroCopyInputStream._0_1_ =
             pFVar8 != (FieldDescriptor *)0x0;
        if (pFVar8 == (FieldDescriptor *)0x0) {
          testing::Message::Message((Message *)&gtest_ar__1);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar_,(internal *)&raw_input,
                     (AssertionResult *)"dynamic_message_extension != nullptr","false","true",in_R9)
          ;
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_4b8,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_unittest.cc"
                     ,0x53e,(char *)gtest_ar_._0_8_);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_4b8,(Message *)&gtest_ar__1);
          goto LAB_00553012;
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&raw_input.data_);
        MVar11 = Message::GetMetadata
                           ((Message *)proto2_unittest::_TestAllExtensions_default_instance_);
        pMVar9 = Reflection::GetMessage
                           (MVar11.reflection,
                            (Message *)proto2_unittest::_TestAllExtensions_default_instance_,pFVar8,
                            &dynamic_factory.super_MessageFactory);
        pDVar2 = FieldDescriptor::message_type(pFVar8);
        raw_input.super_ZeroCopyInputStream._vptr_ZeroCopyInputStream =
             (_func_int **)DynamicMessageFactory::GetPrototype(&dynamic_factory,pDVar2);
        gtest_ar__1._0_8_ = pMVar9;
        testing::internal::
        CmpHelperEQ<google::protobuf::Message_const*,google::protobuf::Message_const*>
                  ((internal *)&gtest_ar_,"prototype","&sub_message",(Message **)&raw_input,
                   (Message **)&gtest_ar__1);
        if (gtest_ar_.success_ == false) {
          testing::Message::Message((Message *)&gtest_ar__1);
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar_.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl ==
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pcVar10 = anon_var_dwarf_651463 + 5;
          }
          else {
            pcVar10 = *(char **)gtest_ar_.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_4b8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_unittest.cc"
                     ,0x544,pcVar10);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_4b8,(Message *)&gtest_ar__1);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_4b8);
          if (gtest_ar__1._0_8_ != 0) {
            (**(code **)(*(long *)gtest_ar__1._0_8_ + 8))();
          }
        }
        this_04 = &gtest_ar_.message_;
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(this_04);
    }
    else {
      testing::Message::Message((Message *)&gtest_ar_1);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_4b8,(internal *)&gtest_ar__4,
                 (AssertionResult *)"WireFormat::ParseAndMergePartial(&input, &message2)","false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_478,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_unittest.cc"
                 ,0x527,local_4b8._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_478,(Message *)&gtest_ar_1);
LAB_00552c3f:
      testing::internal::AssertHelper::~AssertHelper(&local_478);
      std::__cxx11::string::~string((string *)&local_4b8);
      if ((long *)CONCAT71(gtest_ar_1._1_7_,gtest_ar_1.success_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(gtest_ar_1._1_7_,gtest_ar_1.success_) + 8))();
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar__4.message_);
      io::CodedInputStream::~CodedInputStream((CodedInputStream *)&gtest_ar_);
      proto2_unittest::TestAllExtensions::~TestAllExtensions((TestAllExtensions *)&raw_input);
    }
    std::__cxx11::string::~string((string *)&message_text);
  }
  else {
    testing::Message::Message((Message *)&local_4b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&message_text,(internal *)&gtest_ar__1,
               (AssertionResult *)"message.ParseFromCodedStream(&input)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__4,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_unittest.cc"
               ,0x502,message_text._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__4,(Message *)&local_4b8);
LAB_00552918:
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__4);
    std::__cxx11::string::~string((string *)&message_text);
    if ((long *)local_4b8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_4b8._M_dataplus._M_p + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar__1.message_);
    io::CodedInputStream::~CodedInputStream((CodedInputStream *)&gtest_ar_);
  }
  proto2_unittest::TestAllExtensions::~TestAllExtensions(&message);
  proto2_unittest::TestDynamicExtensions::~TestDynamicExtensions(&dynamic_extension);
  std::__cxx11::string::~string((string *)&data);
  DynamicMessageFactory::~DynamicMessageFactory(&dynamic_factory);
LAB_005530ca:
  DescriptorPool::~DescriptorPool(&dynamic_pool);
  DescriptorProto::~DescriptorProto(&template_descriptor_proto);
  FileDescriptorProto::~FileDescriptorProto(&dynamic_proto);
  return;
}

Assistant:

TEST(ExtensionSetTest, DynamicExtensions) {
  // Test adding a dynamic extension to a compiled-in message object.

  FileDescriptorProto dynamic_proto;
  unittest::TestDynamicExtensions::descriptor()->file()->CopyHeadingTo(
      &dynamic_proto);
  dynamic_proto.clear_dependency();
  dynamic_proto.set_name("dynamic_extensions_test.proto");
  dynamic_proto.add_dependency(
      unittest::TestAllExtensions::descriptor()->file()->name());
  dynamic_proto.set_package("dynamic_extensions");

  // Copy the fields and nested types from TestDynamicExtensions into our new
  // proto, converting the fields into extensions.
  const Descriptor* template_descriptor =
      unittest::TestDynamicExtensions::descriptor();
  DescriptorProto template_descriptor_proto;
  template_descriptor->CopyTo(&template_descriptor_proto);
  dynamic_proto.mutable_message_type()->MergeFrom(
      template_descriptor_proto.nested_type());
  dynamic_proto.mutable_enum_type()->MergeFrom(
      template_descriptor_proto.enum_type());
  dynamic_proto.mutable_extension()->MergeFrom(
      template_descriptor_proto.field());

  // For each extension that we added...
  for (int i = 0; i < dynamic_proto.extension_size(); i++) {
    // Set its extendee to TestAllExtensions.
    FieldDescriptorProto* extension = dynamic_proto.mutable_extension(i);
    extension->set_extendee(
        unittest::TestAllExtensions::descriptor()->full_name());

    // If the field refers to one of the types nested in TestDynamicExtensions,
    // make it refer to the type in our dynamic proto instead.
    std::string prefix =
        absl::StrCat(".", template_descriptor->full_name(), ".");
    if (extension->has_type_name()) {
      std::string* type_name = extension->mutable_type_name();
      if (absl::StartsWith(*type_name, prefix)) {
        type_name->replace(0, prefix.size(), ".dynamic_extensions.");
      }
    }
  }

  // Now build the file, using the generated pool as an underlay.
  DescriptorPool dynamic_pool(DescriptorPool::generated_pool());
  const FileDescriptor* file = dynamic_pool.BuildFile(dynamic_proto);
  ASSERT_TRUE(file != nullptr);
  DynamicMessageFactory dynamic_factory(&dynamic_pool);
  dynamic_factory.SetDelegateToGeneratedFactory(true);

  // Construct a message that we can parse with the extensions we defined.
  // Since the extensions were based off of the fields of TestDynamicExtensions,
  // we can use that message to create this test message.
  std::string data;
  unittest::TestDynamicExtensions dynamic_extension;
  {
    unittest::TestDynamicExtensions message;
    message.set_scalar_extension(123);
    message.set_enum_extension(unittest::FOREIGN_BAR);
    message.set_dynamic_enum_extension(
        unittest::TestDynamicExtensions::DYNAMIC_BAZ);
    message.mutable_message_extension()->set_c(456);
    message.mutable_dynamic_message_extension()->set_dynamic_field(789);
    message.add_repeated_extension("foo");
    message.add_repeated_extension("bar");
    message.add_packed_extension(12);
    message.add_packed_extension(-34);
    message.add_packed_extension(56);
    message.add_packed_extension(-78);

    // Also add some unknown fields.

    // An unknown enum value (for a known field).
    message.mutable_unknown_fields()->AddVarint(
        unittest::TestDynamicExtensions::kDynamicEnumExtensionFieldNumber,
        12345);
    // A regular unknown field.
    message.mutable_unknown_fields()->AddLengthDelimited(54321, "unknown");

    message.SerializeToString(&data);
    dynamic_extension = message;
  }

  // Now we can parse this using our dynamic extension definitions...
  unittest::TestAllExtensions message;
  {
    io::ArrayInputStream raw_input(data.data(), data.size());
    io::CodedInputStream input(&raw_input);
    input.SetExtensionRegistry(&dynamic_pool, &dynamic_factory);
    ASSERT_TRUE(message.ParseFromCodedStream(&input));
    ASSERT_TRUE(input.ConsumedEntireMessage());
  }

  // Can we print it?
  std::string message_text;
  TextFormat::PrintToString(message, &message_text);
  EXPECT_EQ(
      "[dynamic_extensions.scalar_extension]: 123\n"
      "[dynamic_extensions.enum_extension]: FOREIGN_BAR\n"
      "[dynamic_extensions.dynamic_enum_extension]: DYNAMIC_BAZ\n"
      "[dynamic_extensions.message_extension] {\n"
      "  c: 456\n"
      "}\n"
      "[dynamic_extensions.dynamic_message_extension] {\n"
      "  dynamic_field: 789\n"
      "}\n"
      "[dynamic_extensions.repeated_extension]: \"foo\"\n"
      "[dynamic_extensions.repeated_extension]: \"bar\"\n"
      "[dynamic_extensions.packed_extension]: 12\n"
      "[dynamic_extensions.packed_extension]: -34\n"
      "[dynamic_extensions.packed_extension]: 56\n"
      "[dynamic_extensions.packed_extension]: -78\n"
      "2002: 12345\n"
      "54321: \"unknown\"\n",
      message_text);

  // Can we serialize it?
  EXPECT_TRUE(
      EqualsToSerialized(dynamic_extension, message.SerializeAsString()));

  // What if we parse using the reflection-based parser?
  {
    unittest::TestAllExtensions message2;
    io::ArrayInputStream raw_input(data.data(), data.size());
    io::CodedInputStream input(&raw_input);
    input.SetExtensionRegistry(&dynamic_pool, &dynamic_factory);
    ASSERT_TRUE(WireFormat::ParseAndMergePartial(&input, &message2));
    ASSERT_TRUE(input.ConsumedEntireMessage());
    EXPECT_EQ(message.DebugString(), message2.DebugString());
  }

  // Are the embedded generated types actually using the generated objects?
  {
    const FieldDescriptor* message_extension =
        file->FindExtensionByName("message_extension");
    ASSERT_TRUE(message_extension != nullptr);
    const Message& sub_message =
        message.GetReflection()->GetMessage(message, message_extension);
    const unittest::ForeignMessage* typed_sub_message =
        google::protobuf::DynamicCastMessage<unittest::ForeignMessage>(&sub_message);
    ASSERT_TRUE(typed_sub_message != nullptr);
    EXPECT_EQ(456, typed_sub_message->c());
  }

  // What does GetMessage() return for the embedded dynamic type if it isn't
  // present?
  {
    const FieldDescriptor* dynamic_message_extension =
        file->FindExtensionByName("dynamic_message_extension");
    ASSERT_TRUE(dynamic_message_extension != nullptr);
    const Message& parent = unittest::TestAllExtensions::default_instance();
    const Message& sub_message = parent.GetReflection()->GetMessage(
        parent, dynamic_message_extension, &dynamic_factory);
    const Message* prototype =
        dynamic_factory.GetPrototype(dynamic_message_extension->message_type());
    EXPECT_EQ(prototype, &sub_message);
  }
}